

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
pstore::uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>
          (uint128 *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out)

{
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = 0x7c; uVar2 != 0xfffffffc; uVar2 = uVar2 - 4) {
    uVar1 = __lshrti3((long)this->v_,*(undefined8 *)((long)&this->v_ + 8),uVar2 & 0xff);
    digit_to_hex(uVar1 & 0xf);
    std::__cxx11::string::push_back((char)out.container);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator uint128::to_hex (OutputIterator out) const noexcept {
#ifndef NDEBUG
        auto emitted = 0U;
#endif
#ifdef PSTORE_HAVE_UINT128_T
        for (auto shift = 4U; shift <= 128U; shift += 4U) {
            *(out++) = digit_to_hex ((v_ >> (128U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#else
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((high_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((low_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#endif
        PSTORE_ASSERT (emitted == hex_string_length);
        return out;
    }